

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool __thiscall
duckdb::
IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
          (duckdb *this,char *buf,idx_t len,IntegerCastData<short> *result,bool strict)

{
  duckdb dVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  short sVar6;
  bool bVar7;
  
  if (buf < (char *)0x2) {
    pcVar4 = &DAT_00000001;
  }
  else {
    sVar6 = *(short *)len;
    pcVar3 = &DAT_00000001;
    do {
      dVar1 = this[(long)pcVar3];
      bVar2 = (char)dVar1 - 0x30;
      if (9 < bVar2) {
        if (dVar1 == (duckdb)0x2c) {
          pcVar4 = pcVar3 + 1;
          if (buf <= pcVar4) {
            if (pcVar3 < (char *)0x2) {
              return false;
            }
            break;
          }
          bVar7 = pcVar3 < (char *)0x2;
          dVar1 = (this + 1)[(long)pcVar3];
          pcVar3 = pcVar4;
          if ((byte)((char)dVar1 - 0x30U) < 10 || bVar7) {
            return false;
          }
        }
        if (0x20 < (byte)dVar1) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)dVar1 & 0x3f) & 1) == 0) {
          return false;
        }
        pcVar3 = pcVar3 + 1;
        pcVar4 = pcVar3;
        if (pcVar3 < buf) {
          do {
            if ((0x20 < (ulong)(byte)this[(long)pcVar3]) ||
               ((0x100003e00U >> ((ulong)(byte)this[(long)pcVar3] & 0x3f) & 1) == 0)) {
              return false;
            }
            pcVar3 = pcVar3 + 1;
            pcVar4 = buf;
          } while (buf != pcVar3);
        }
        break;
      }
      if ((int)sVar6 < (int)-((ushort)(0x8000 - bVar2) / 10)) {
        return false;
      }
      pcVar5 = pcVar3 + 1;
      sVar6 = sVar6 * 10 - (ushort)bVar2;
      *(short *)len = sVar6;
      pcVar4 = buf;
      if (pcVar5 == buf) break;
      if (this[(long)pcVar5] == (duckdb)0x5f) {
        pcVar5 = pcVar3 + 2;
        if (pcVar5 == buf) {
          return false;
        }
        if (9 < (byte)((char)this[(long)pcVar5] - 0x30U)) {
          return false;
        }
      }
      pcVar4 = pcVar5;
      pcVar3 = pcVar5;
    } while (pcVar5 < buf);
  }
  return &DAT_00000001 < pcVar4;
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}